

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::AnimationStack::AnimationStack
          (AnimationStack *this,uint64_t id,Element *element,string *name,Document *doc)

{
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *this_00
  ;
  Scope *pSVar1;
  bool bVar2;
  uint64_t dest;
  size_type __n;
  reference ppCVar3;
  long lVar4;
  value_type local_198;
  allocator<char> local_119;
  string local_118;
  value_type local_f8;
  AnimationLayer *anim;
  string local_e8;
  Object *local_c8;
  Object *ob;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_88;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  string local_78;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_58 [2];
  Scope *local_38;
  Scope *sc;
  Document *doc_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  AnimationStack *this_local;
  
  sc = (Scope *)doc;
  doc_local = (Document *)name;
  name_local = (string *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  FBX::Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationStack_0100d358;
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  std::
  vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ::vector(&this->layers);
  local_38 = GetRequiredScope((Element *)name_local);
  pSVar1 = sc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"AnimationStack.FbxAnimStack",(allocator<char> *)((long)&conns + 7)
            );
  Util::GetPropertyTable
            ((Util *)local_58,(Document *)pSVar1,&local_78,(Element *)name_local,local_38,true);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,local_58);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&conns + 7));
  pSVar1 = sc;
  dest = FBX::Object::ID(&this->super_Object);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2,(Document *)pSVar1,dest,"AnimationLayer");
  local_88 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2;
  __n = std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        size(local_88);
  std::
  vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ::reserve(&this->layers,__n);
  this_00 = local_88;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin(local_88);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                     *)&con), bVar2) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    ob = (Object *)*ppCVar3;
    Connection::PropertyName_abi_cxx11_((Connection *)ob);
    lVar4 = std::__cxx11::string::length();
    if (lVar4 == 0) {
      local_c8 = Connection::SourceObject((Connection *)ob);
      if (local_c8 == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,
                   "failed to read source object for AnimationLayer->AnimationStack link, ignoring",
                   (allocator<char> *)((long)&anim + 7));
        Util::DOMWarning(&local_e8,(Element *)name_local);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anim + 7));
      }
      else {
        if (local_c8 == (Object *)0x0) {
          local_198 = (value_type)0x0;
        }
        else {
          local_198 = (value_type)
                      __dynamic_cast(local_c8,&FBX::Object::typeinfo,&AnimationLayer::typeinfo,0);
        }
        local_f8 = local_198;
        if (local_198 == (value_type)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,
                     "source object for ->AnimationStack link is not an AnimationLayer",&local_119);
          Util::DOMWarning(&local_118,(Element *)name_local);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
        }
        else {
          std::
          vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
          ::push_back(&this->layers,&local_f8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)&__range2);
  return;
}

Assistant:

AnimationStack::AnimationStack(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Object(id, element, name)
{
    const Scope& sc = GetRequiredScope(element);

    // note: we don't currently use any of these properties so we shouldn't bother if it is missing
    props = GetPropertyTable(doc,"AnimationStack.FbxAnimStack",element,sc, true);

    // resolve attached animation layers
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationLayer");
    layers.reserve(conns.size());

    for(const Connection* con : conns) {

        // link should not go to a property
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for AnimationLayer->AnimationStack link, ignoring",&element);
            continue;
        }

        const AnimationLayer* const anim = dynamic_cast<const AnimationLayer*>(ob);
        if(!anim) {
            DOMWarning("source object for ->AnimationStack link is not an AnimationLayer",&element);
            continue;
        }
        layers.push_back(anim);
    }
}